

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bpattern(bstring b,int len)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar3 = -1;
  if (b != (bstring)0x0) {
    uVar1 = b->slen;
    uVar5 = (ulong)(int)uVar1;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = uVar1;
    }
    if (-1 < len && 0 < (long)uVar5) {
      iVar2 = balloc(b,len + 1);
      if (iVar2 == 0) {
        if (len != 0) {
          if (uVar1 == 1) {
            iVar3 = bsetstr(b,len,(bstring)0x0,*b->data);
            return iVar3;
          }
          for (; uVar5 < (uint)len; uVar5 = uVar5 + 1) {
            b->data[uVar5] = b->data[uVar5 - uVar4];
          }
        }
        b->data[(uint)len] = '\0';
        b->slen = len;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int bpattern (bstring b, int len) {
int i, d;

	d = blength (b);
	if (d <= 0 || len < 0 || balloc (b, len + 1) != BSTR_OK) return BSTR_ERR;
	if (len > 0) {
		if (d == 1) return bsetstr (b, len, NULL, b->data[0]);
		for (i = d; i < len; i++) b->data[i] = b->data[i - d];
	}
	b->data[len] = (unsigned char) '\0';
	b->slen = len;
	return 0;
}